

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::MainBuilder::Impl> __thiscall
kj::heap<kj::MainBuilder::Impl,kj::ProcessContext&,kj::StringPtr&,kj::StringPtr&,kj::StringPtr&>
          (kj *this,ProcessContext *params,StringPtr *params_1,StringPtr *params_2,
          StringPtr *params_3)

{
  Impl *this_00;
  Impl *extraout_RDX;
  Own<kj::MainBuilder::Impl> OVar1;
  
  this_00 = (Impl *)operator_new(0x120);
  MainBuilder::Impl::Impl
            (this_00,params,(StringPtr)params_1->content,(StringPtr)params_2->content,
             (StringPtr)params_3->content);
  *(undefined8 **)this = &_::HeapDisposer<kj::MainBuilder::Impl>::instance;
  *(Impl **)(this + 8) = this_00;
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}